

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logException
          (RootExceptionCallback *this,LogSeverity severity,Exception *e)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ArrayPtr<void_*const> trace;
  ExceptionCallback *pEVar4;
  char *pcVar5;
  ArrayPtr<void_*const> trace_00;
  char (*in_stack_ffffffffffffff58) [2];
  Type local_9c;
  StringPtr local_98;
  char *local_88;
  ulong local_80;
  Array<char> local_78;
  Array<char> local_60;
  Array<char> local_48;
  
  pEVar4 = getExceptionCallback();
  pcVar2 = e->file;
  uVar1 = e->line;
  local_9c = e->type;
  uVar3 = (e->description).content.size_;
  local_88 = "";
  if (uVar3 != 0) {
    local_88 = (e->description).content.ptr;
  }
  local_80 = 1;
  if (1 < uVar3) {
    local_80 = uVar3;
  }
  local_98.content.size_ = 0x1ac71f;
  if (1 >= uVar3) {
    local_98.content.size_ = 0x1ae02f;
  }
  pcVar5 = "\nstack: ";
  if (e->traceCount == 0) {
    pcVar5 = "";
  }
  trace.size_ = (size_t)in_stack_ffffffffffffff58;
  trace.ptr = (void **)0x18db07;
  local_98.content.ptr = pcVar5;
  stringifyStackTraceAddresses(trace);
  trace_00.ptr = (void **)(ulong)e->traceCount;
  trace_00.size_ = (size_t)pcVar5;
  stringifyStackTrace((String *)&local_48,(kj *)e->trace,trace_00);
  str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
            ((String *)&local_60,(kj *)&local_9c,(Type *)&local_98.content.size_,&local_88,&local_98
             ,&local_78.ptr,(String *)&local_48,(String *)0x1ae02e,in_stack_ffffffffffffff58);
  (*pEVar4->_vptr_ExceptionCallback[4])(pEVar4,severity,pcVar2,(ulong)uVar1,0,&local_60);
  Array<char>::~Array(&local_60);
  Array<char>::~Array(&local_48);
  Array<char>::~Array(&local_78);
  return;
}

Assistant:

void logException(LogSeverity severity, Exception&& e) {
    // We intentionally go back to the top exception callback on the stack because we don't want to
    // bypass whatever log processing is in effect.
    //
    // We intentionally don't log the context since it should get re-added by the exception callback
    // anyway.
    getExceptionCallback().logMessage(severity, e.getFile(), e.getLine(), 0, str(
        e.getType(), e.getDescription() == nullptr ? "" : ": ", e.getDescription(),
        e.getStackTrace().size() > 0 ? "\nstack: " : "",
        stringifyStackTraceAddresses(e.getStackTrace()),
        stringifyStackTrace(e.getStackTrace()), "\n"));
  }